

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void EncloseBlockText(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  uint uVar3;
  Bool BVar4;
  Node *node_00;
  Node **ppNVar5;
  Node *node_01;
  Node *pNVar6;
  
  while (pNVar6 = node, pNVar6 != (Node *)0x0) {
    while( true ) {
      node = pNVar6->next;
      if (pNVar6->content != (Node *)0x0) {
        EncloseBlockText(doc,pNVar6->content);
      }
      if (((((pNVar6->tag == (Dict *)0x0) ||
            (uVar3 = pNVar6->tag->id - TidyTag_BLOCKQUOTE, 0x3c < uVar3)) ||
           ((0x1000000000400001U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) ||
          (node_01 = pNVar6->content, node_01 == (Node *)0x0)) ||
         (((BVar4 = prvTidynodeIsText(node_01), BVar4 == no ||
           (BVar4 = prvTidyIsBlank(doc->lexer,node_01), BVar4 != no)) &&
          ((BVar4 = prvTidynodeIsElement(node_01), BVar4 == no ||
           (BVar4 = nodeCMIsOnlyInline(node_01), BVar4 == no)))))) break;
      node_00 = prvTidyInferredTag(doc,TidyTag_P);
      prvTidyInsertNodeBeforeElement(node_01,node_00);
      while ((node_01 != (Node *)0x0 &&
             ((BVar4 = prvTidynodeIsElement(node_01), BVar4 == no ||
              (BVar4 = nodeCMIsOnlyInline(node_01), BVar4 != no))))) {
        pNVar1 = node_01->next;
        prvTidyRemoveNode(node_01);
        node_01->parent = node_00;
        pNVar2 = node_00->last;
        ppNVar5 = &pNVar2->next;
        if (pNVar2 == (Node *)0x0) {
          ppNVar5 = &node_00->content;
        }
        node_01->prev = pNVar2;
        *ppNVar5 = node_01;
        node_00->last = node_01;
        node_01 = pNVar1;
      }
      TrimSpaces(doc,node_00);
    }
  }
  return;
}

Assistant:

static void EncloseBlockText(TidyDocImpl* doc, Node* node)
{
    Node *next;
    Node *block;

    while (node)
    {
        next = node->next;

        if (node->content)
            EncloseBlockText(doc, node->content);

        if (!(nodeIsFORM(node) || nodeIsNOSCRIPT(node) ||
              nodeIsBLOCKQUOTE(node))
            || !node->content)
        {
            node = next;
            continue;
        }

        block = node->content;

        if ((TY_(nodeIsText)(block) && !TY_(IsBlank)(doc->lexer, block)) ||
            (TY_(nodeIsElement)(block) && nodeCMIsOnlyInline(block)))
        {
            Node* p = TY_(InferredTag)(doc, TidyTag_P);
            TY_(InsertNodeBeforeElement)(block, p);
            while (block &&
                   (!TY_(nodeIsElement)(block) || nodeCMIsOnlyInline(block)))
            {
                Node* tempNext = block->next;
                TY_(RemoveNode)(block);
                TY_(InsertNodeAtEnd)(p, block);
                block = tempNext;
            }
            TrimSpaces(doc, p);
            continue;
        }

        node = next;
    }
}